

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_tableinout_function.cpp
# Opt level: O3

unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true> __thiscall
duckdb::PhysicalTableInOutFunction::GetOperatorState
          (PhysicalTableInOutFunction *this,ExecutionContext *context)

{
  optional_ptr<const_duckdb::FunctionData,_true> bind_data_p;
  _Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false> _Var1;
  PhysicalOperator *pPVar2;
  pointer puVar3;
  TableInOutLocalState *this_00;
  pointer pTVar4;
  const_reference pvVar5;
  const_reference __x;
  undefined8 *in_RDX;
  size_type sVar6;
  size_type __n;
  TableFunctionInitInput input;
  _Head_base<0UL,_duckdb::TableInOutLocalState_*,_false> local_d0;
  vector<unsigned_long,_true> local_c8;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> local_b0;
  TableFunctionInitInput local_98;
  
  unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>,_true>::
  operator->((unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>,_true>
              *)&context[3].thread);
  this_00 = (TableInOutLocalState *)operator_new(0x60);
  TableInOutLocalState::TableInOutLocalState(this_00);
  local_d0._M_head_impl = this_00;
  if (context[0xf].client != (ClientContext *)0x0) {
    bind_data_p.ptr = (FunctionData *)context[0x17].pipeline.ptr;
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::vector
              (&local_b0,
               (vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)(context + 0x18)
              );
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TableFunctionInitInput::TableFunctionInitInput
              (&local_98,bind_data_p,(vector<duckdb::ColumnIndex,_true> *)&local_b0,&local_c8,
               (optional_ptr<duckdb::TableFilterSet,_true>)0x0,
               (optional_ptr<duckdb::SampleOptions,_true>)0x0);
    if ((LocalTableFunctionState *)
        local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (LocalTableFunctionState *)0x0) {
      operator_delete(local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector(&local_b0);
    (*(code *)context[0xf].client)(&local_c8);
    pTVar4 = unique_ptr<duckdb::TableInOutLocalState,_std::default_delete<duckdb::TableInOutLocalState>,_true>
             ::operator->((unique_ptr<duckdb::TableInOutLocalState,_std::default_delete<duckdb::TableInOutLocalState>,_true>
                           *)&local_d0);
    puVar3 = local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _Var1._M_head_impl =
         (pTVar4->local_state).
         super_unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LocalTableFunctionState_*,_std::default_delete<duckdb::LocalTableFunctionState>_>
         .super__Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false>._M_head_impl;
    (pTVar4->local_state).
    super_unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::LocalTableFunctionState_*,_std::default_delete<duckdb::LocalTableFunctionState>_>
    .super__Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false>._M_head_impl =
         (LocalTableFunctionState *)puVar3;
    if (_Var1._M_head_impl != (LocalTableFunctionState *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_LocalTableFunctionState[1])();
      if (local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*local_c8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start + 8))();
      }
    }
    if (local_98.projection_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.projection_ids.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
              (&local_98.column_indexes.
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
    if (local_98.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.column_ids.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (context[0x19].client != (ClientContext *)context[0x19].thread) {
    local_98.bind_data.ptr = (FunctionData *)0x0;
    local_98.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pvVar5 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                       ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                        &context->pipeline,0);
    pPVar2 = pvVar5->_M_data;
    sVar6 = ((long)(pPVar2->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pPVar2->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
            ((long)context[0x19].thread - (long)context[0x19].client >> 3);
    if (sVar6 != 0) {
      __n = 0;
      do {
        __x = vector<duckdb::LogicalType,_true>::operator[](&pPVar2->types,__n);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_98,
                   __x);
        __n = __n + 1;
      } while (sVar6 != __n);
    }
    pTVar4 = unique_ptr<duckdb::TableInOutLocalState,_std::default_delete<duckdb::TableInOutLocalState>,_true>
             ::operator->((unique_ptr<duckdb::TableInOutLocalState,_std::default_delete<duckdb::TableInOutLocalState>,_true>
                           *)&local_d0);
    DataChunk::Initialize
              (&pTVar4->input_chunk,(ClientContext *)*in_RDX,
               (vector<duckdb::LogicalType,_true> *)&local_98,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_98);
  }
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)local_d0._M_head_impl;
  return (unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>)
         (unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>)this;
}

Assistant:

unique_ptr<OperatorState> PhysicalTableInOutFunction::GetOperatorState(ExecutionContext &context) const {
	auto &gstate = op_state->Cast<TableInOutGlobalState>();
	auto result = make_uniq<TableInOutLocalState>();
	if (function.init_local) {
		TableFunctionInitInput input(bind_data.get(), column_ids, vector<idx_t>(), nullptr);
		result->local_state = function.init_local(context, input, gstate.global_state.get());
	}
	if (!projected_input.empty()) {
		vector<LogicalType> input_types;
		auto &child_types = children[0].get().GetTypes();
		idx_t input_length = child_types.size() - projected_input.size();
		for (idx_t k = 0; k < input_length; k++) {
			input_types.push_back(child_types[k]);
		}
		for (idx_t k = 0; k < projected_input.size(); k++) {
			D_ASSERT(projected_input[k] >= input_length);
		}
		result->input_chunk.Initialize(context.client, input_types);
	}
	return std::move(result);
}